

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O0

bool __thiscall
ON_RevSurface::Split
          (ON_RevSurface *this,int dir,double c,ON_Surface **west_or_south_side,
          ON_Surface **east_or_north_side)

{
  _func_int **pp_Var1;
  double dVar2;
  ON_Surface **ppOVar3;
  ON_Surface **ppOVar4;
  bool bVar5;
  uint uVar6;
  double *pdVar7;
  ON_RevSurface *pOVar8;
  double dVar9;
  ON_BoundingBox local_150;
  ON_BoundingBox local_120;
  undefined1 local_e0 [8];
  ON_BoundingBox input_bbox;
  double a;
  double t;
  ON_Interval right_t;
  ON_Interval left_t;
  ON_Interval right_angle;
  ON_Interval left_angle;
  ON_Curve *right_side;
  ON_Curve *left_side;
  ON_RevSurface *srf_en;
  ON_RevSurface *srf_ws;
  ON_Surface **ppOStack_38;
  bool rc;
  ON_Surface **east_or_north_side_local;
  ON_Surface **west_or_south_side_local;
  double c_local;
  ON_RevSurface *pOStack_18;
  int dir_local;
  ON_RevSurface *this_local;
  
  srf_ws._7_1_ = 0;
  ppOStack_38 = east_or_north_side;
  east_or_north_side_local = west_or_south_side;
  west_or_south_side_local = (ON_Surface **)c;
  c_local._4_4_ = dir;
  pOStack_18 = this;
  srf_en = Cast((ON_Object *)*west_or_south_side);
  left_side = (ON_Curve *)Cast((ON_Object *)*ppOStack_38);
  if ((srf_en == (ON_RevSurface *)0x0) || (srf_en != (ON_RevSurface *)left_side)) {
    if ((*east_or_north_side_local == (ON_Surface *)0x0) || (srf_en != (ON_RevSurface *)0x0)) {
      if ((*ppOStack_38 == (ON_Surface *)0x0) ||
         ((ON_RevSurface *)left_side != (ON_RevSurface *)0x0)) {
        if ((c_local._4_4_ == 0) || (c_local._4_4_ == 1)) {
          if ((this->m_bTransposed & 1U) != 0) {
            c_local._4_4_ = 1 - c_local._4_4_;
          }
          right_side = (ON_Curve *)0x0;
          left_angle.m_t[1] = 0.0;
          ON_Interval::ON_Interval((ON_Interval *)(right_angle.m_t + 1));
          ON_Interval::ON_Interval((ON_Interval *)(left_t.m_t + 1));
          ON_Interval::ON_Interval((ON_Interval *)(right_t.m_t + 1));
          ON_Interval::ON_Interval((ON_Interval *)&t);
          right_angle.m_t[1] = (this->m_angle).m_t[0];
          left_angle.m_t[0] = (this->m_angle).m_t[1];
          left_t.m_t[1] = (this->m_angle).m_t[0];
          right_angle.m_t[0] = (this->m_angle).m_t[1];
          right_t.m_t[1] = (this->m_t).m_t[0];
          left_t.m_t[0] = (this->m_t).m_t[1];
          t = (this->m_t).m_t[0];
          right_t.m_t[0] = (this->m_t).m_t[1];
          if (c_local._4_4_ == 0) {
            dVar9 = ON_Interval::NormalizedParameterAt(&this->m_t,(double)west_or_south_side_local);
            bVar5 = ON_Interval::Includes(&this->m_t,(double)west_or_south_side_local,true);
            if (((bVar5) && (0.0 < dVar9)) && (dVar9 < 1.0)) {
              input_bbox.m_max.z = ON_Interval::ParameterAt(&this->m_angle,dVar9);
              bVar5 = ON_Interval::Includes(&this->m_angle,input_bbox.m_max.z,true);
              dVar9 = input_bbox.m_max.z;
              if (bVar5) {
                srf_ws._7_1_ = 1;
                pdVar7 = ON_Interval::operator[]((ON_Interval *)(right_angle.m_t + 1),1);
                dVar2 = input_bbox.m_max.z;
                *pdVar7 = dVar9;
                pdVar7 = ON_Interval::operator[]((ON_Interval *)(left_t.m_t + 1),0);
                ppOVar3 = west_or_south_side_local;
                *pdVar7 = dVar2;
                pdVar7 = ON_Interval::operator[]((ON_Interval *)(right_t.m_t + 1),1);
                ppOVar4 = west_or_south_side_local;
                *pdVar7 = (double)ppOVar3;
                pdVar7 = ON_Interval::operator[]((ON_Interval *)&t,0);
                *pdVar7 = (double)ppOVar4;
                if (srf_en == this) {
                  right_side = this->m_curve;
                }
                else {
                  right_side = ON_Curve::Duplicate(this->m_curve);
                }
                if ((ON_RevSurface *)left_side == this) {
                  left_angle.m_t[1] = (double)this->m_curve;
                }
                else {
                  left_angle.m_t[1] = (double)ON_Curve::Duplicate(this->m_curve);
                }
              }
            }
          }
          else if ((c_local._4_4_ == 1) && (this->m_curve != (ON_Curve *)0x0)) {
            uVar6 = (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x3e])
                              (west_or_south_side_local,this->m_curve,&right_side,left_angle.m_t + 1
                              );
            srf_ws._7_1_ = (byte)uVar6 & 1;
            if ((uVar6 & 1) != 0) {
              if (this == srf_en) {
                if (this->m_curve != (ON_Curve *)0x0) {
                  (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                }
                srf_en->m_curve = right_side;
              }
              else if (this == (ON_RevSurface *)left_side) {
                if (this->m_curve != (ON_Curve *)0x0) {
                  (*(this->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
                }
                left_side[1].super_ON_Geometry.super_ON_Object._vptr_ON_Object =
                     (_func_int **)left_angle.m_t[1];
              }
            }
          }
          if ((srf_ws._7_1_ & 1) != 0) {
            memcpy(local_e0,&this->m_bbox,0x30);
            if (srf_en == (ON_RevSurface *)0x0) {
              pOVar8 = (ON_RevSurface *)operator_new(0xa0);
              ON_RevSurface(pOVar8);
              *east_or_north_side_local = (ON_Surface *)pOVar8;
              srf_en = pOVar8;
            }
            else if ((srf_en != this) && (srf_en->m_curve != (ON_Curve *)0x0)) {
              if (srf_en->m_curve != (ON_Curve *)0x0) {
                (*(srf_en->m_curve->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])();
              }
              srf_en->m_curve = (ON_Curve *)0x0;
            }
            if (left_side == (ON_Curve *)0x0) {
              pOVar8 = (ON_RevSurface *)operator_new(0xa0);
              ON_RevSurface(pOVar8);
              *ppOStack_38 = (ON_Surface *)pOVar8;
              left_side = (ON_Curve *)pOVar8;
            }
            if (((ON_RevSurface *)left_side != this) &&
               (left_side[1].super_ON_Geometry.super_ON_Object._vptr_ON_Object != (_func_int **)0x0)
               ) {
              pp_Var1 = left_side[1].super_ON_Geometry.super_ON_Object._vptr_ON_Object;
              if (pp_Var1 != (_func_int **)0x0) {
                (**(code **)(*pp_Var1 + 0x20))();
              }
              left_side[1].super_ON_Geometry.super_ON_Object._vptr_ON_Object = (_func_int **)0x0;
            }
            memcpy(&srf_en->m_axis,&this->m_axis,0x30);
            (srf_en->m_angle).m_t[0] = right_angle.m_t[1];
            (srf_en->m_angle).m_t[1] = left_angle.m_t[0];
            (srf_en->m_t).m_t[0] = right_t.m_t[1];
            (srf_en->m_t).m_t[1] = left_t.m_t[0];
            srf_en->m_bTransposed = (bool)(this->m_bTransposed & 1);
            srf_en->m_curve = right_side;
            ON_BoundingBox::Destroy(&srf_en->m_bbox);
            memcpy(&left_side[1].super_ON_Geometry.super_ON_Object.m_userdata_list,&this->m_axis,
                   0x30);
            left_side[4].super_ON_Geometry.super_ON_Object.m_userdata_list =
                 (ON_UserData *)left_t.m_t[1];
            left_side[5].super_ON_Geometry.super_ON_Object._vptr_ON_Object =
                 (_func_int **)right_angle.m_t[0];
            left_side[5].super_ON_Geometry.super_ON_Object.m_userdata_list = (ON_UserData *)t;
            left_side[6].super_ON_Geometry.super_ON_Object._vptr_ON_Object =
                 (_func_int **)right_t.m_t[0];
            *(byte *)&left_side[6].super_ON_Geometry.super_ON_Object.m_userdata_list =
                 this->m_bTransposed & 1;
            left_side[1].super_ON_Geometry.super_ON_Object._vptr_ON_Object =
                 (_func_int **)left_angle.m_t[1];
            ON_BoundingBox::Destroy((ON_BoundingBox *)(left_side + 7));
            ON_Geometry::BoundingBox(&local_120,(ON_Geometry *)srf_en);
            bVar5 = ON_BoundingBox::IsValid(&srf_en->m_bbox);
            if ((bVar5) && (bVar5 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_e0), bVar5)) {
              ON_BoundingBox::Intersection(&srf_en->m_bbox,(ON_BoundingBox *)local_e0);
            }
            ON_Geometry::BoundingBox(&local_150,&left_side->super_ON_Geometry);
            bVar5 = ON_BoundingBox::IsValid((ON_BoundingBox *)(left_side + 7));
            if ((bVar5) && (bVar5 = ON_BoundingBox::IsValid((ON_BoundingBox *)local_e0), bVar5)) {
              ON_BoundingBox::Intersection
                        ((ON_BoundingBox *)(left_side + 7),(ON_BoundingBox *)local_e0);
            }
          }
          this_local._7_1_ = (bool)(srf_ws._7_1_ & 1);
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_RevSurface::Split(
       int dir,
       double c,
       ON_Surface*& west_or_south_side,
       ON_Surface*& east_or_north_side
       ) const
{
  bool rc = false;

  ON_RevSurface* srf_ws=ON_RevSurface::Cast(west_or_south_side);
  ON_RevSurface* srf_en=ON_RevSurface::Cast(east_or_north_side);
  if ( srf_ws && srf_ws == srf_en )
    return false;
  if ( west_or_south_side && !srf_ws )
    return false;
  if ( east_or_north_side && !srf_en )
    return false;

  if ( dir != 0 && dir != 1 )
    return false;
  if ( m_bTransposed )
    dir = 1-dir;

  ON_Curve* left_side = 0;
  ON_Curve* right_side = 0;
  ON_Interval left_angle, right_angle;
  ON_Interval left_t, right_t;
  left_angle = m_angle;
  right_angle = m_angle;
  left_t = m_t;
  right_t = m_t;

  if ( dir == 0 )
  {
    double t = m_t.NormalizedParameterAt(c);
    if ( m_t.Includes(c,true) && 0.0 < t && t < 1.0 )
    {
      double a = m_angle.ParameterAt( t );
      if ( m_angle.Includes(a,true) )
      {
        rc = true;

        left_angle[1] = a;
        right_angle[0] = a;
        left_t[1] = c;
        right_t[0] = c;

        if ( srf_ws == this )
          left_side = m_curve;
        else
          left_side = m_curve->Duplicate();
        if ( srf_en == this )
          right_side = m_curve;
        else
          right_side = m_curve->Duplicate();
      }
    }
  }
  else if ( dir == 1 && m_curve )
  {
    rc = m_curve->Split( c, left_side, right_side );
    if ( rc )
    {
      if ( this == srf_ws )
      {
        delete m_curve;
        srf_ws->m_curve = left_side;
      }
      else if ( this == srf_en )
      {
        delete m_curve;
        srf_en->m_curve = right_side;
      }
    }
  }

  if ( rc )
  {
    // save input bounding box
    const ON_BoundingBox input_bbox(m_bbox);

    if ( !srf_ws )
      west_or_south_side = srf_ws = new ON_RevSurface();
    else if ( srf_ws != this && srf_ws->m_curve )
    {
      delete srf_ws->m_curve;
      srf_ws->m_curve = 0;
    }
    if ( !srf_en )
      east_or_north_side = srf_en = new ON_RevSurface();
    if ( srf_en != this && srf_en->m_curve )
    {
      delete srf_en->m_curve;
      srf_en->m_curve = 0;
    }

    srf_ws->m_axis = m_axis;
    srf_ws->m_angle = left_angle;
    srf_ws->m_t = left_t;
    srf_ws->m_bTransposed = m_bTransposed;
    srf_ws->m_curve = left_side;
    srf_ws->m_bbox.Destroy();

    srf_en->m_axis = m_axis;
    srf_en->m_angle = right_angle;
    srf_en->m_t = right_t;
    srf_en->m_bTransposed = m_bTransposed;
    srf_en->m_curve = right_side;
    srf_en->m_bbox.Destroy();

    // update bounding boxes
    // if input box was valid, intersect calculated boxes with
    // input box
    srf_ws->BoundingBox(); // calculates srf_ws->m_bbox
    if ( srf_ws->m_bbox.IsValid() && input_bbox.IsValid() )
      srf_ws->m_bbox.Intersection(input_bbox);

    srf_en->BoundingBox(); // calculates srf_en->m_bbox
    if ( srf_en->m_bbox.IsValid() && input_bbox.IsValid() )
      srf_en->m_bbox.Intersection(input_bbox);
  }

  return rc;
}